

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

sxi32 ExprMakeTree(jx9_gen_state *pGen,jx9_expr_node **apNode,sxi32 nToken)

{
  int iVar1;
  jx9_expr_op **ppjVar2;
  uint uVar3;
  sxi32 sVar4;
  uint uVar5;
  sxu32 sVar6;
  ulong uVar7;
  jx9_expr_node *pjVar8;
  jx9_expr_node **ppjVar9;
  SyToken *pSVar10;
  uint uVar11;
  char *pcVar12;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  jx9_expr_node *pjVar17;
  ulong uVar18;
  jx9_expr_node **ppjVar19;
  jx9_expr_node *pjVar20;
  long lVar21;
  jx9_expr_op *pjVar22;
  ulong uVar23;
  jx9_expr_node **ppjVar24;
  int iVar25;
  int iVar26;
  uint uVar27;
  ulong uVar28;
  long lVar29;
  ulong uVar30;
  long lVar31;
  bool bVar32;
  ulong local_80;
  
  if (nToken < 1) {
    return 0;
  }
  uVar23 = (ulong)(uint)nToken;
  if ((nToken == 1) && ((*apNode)->xCode != (ProcNodeConstruct)0x0)) {
    return 0;
  }
  ppjVar24 = apNode + 1;
  for (iVar26 = 0; iVar26 < nToken; iVar26 = iVar26 + 1) {
    uVar30 = (ulong)iVar26;
    pjVar17 = apNode[uVar30];
    if ((pjVar17 != (jx9_expr_node *)0x0) && (pjVar17->pStart->nType == 0x200)) {
      uVar15 = uVar30;
      iVar25 = 1;
      do {
        while( true ) {
          do {
            uVar16 = uVar15 + 1;
            uVar28 = uVar23;
            if ((long)uVar23 <= (long)uVar16) goto LAB_00125115;
            ppjVar19 = ppjVar24 + uVar15;
            uVar15 = uVar16;
          } while (*ppjVar19 == (jx9_expr_node *)0x0);
          uVar11 = (*ppjVar19)->pStart->nType;
          if ((uVar11 >> 10 & 1) != 0) break;
          iVar25 = iVar25 + (uint)((uVar11 >> 9 & 1) != 0);
        }
        bVar32 = 1 < iVar25;
        uVar28 = uVar16;
        iVar25 = iVar25 + -1;
      } while (bVar32);
LAB_00125115:
      iVar25 = (int)uVar28;
      if (1 < iVar25 - iVar26) {
        sVar4 = ExprMakeTree(pGen,ppjVar24 + iVar26,(iVar25 - iVar26) + -1);
        if (sVar4 != 0) {
          return sVar4;
        }
        pjVar17 = apNode[uVar30];
      }
      ExprFreeTree(pGen,pjVar17);
      ExprFreeTree(pGen,apNode[iVar25]);
      apNode[uVar30] = (jx9_expr_node *)0x0;
      apNode[iVar25] = (jx9_expr_node *)0x0;
      iVar26 = iVar25;
    }
  }
  uVar30 = 0xffffffffffffffff;
  uVar15 = 1;
  uVar28 = 0;
  uVar16 = uVar23;
  ppjVar19 = apNode;
LAB_00125193:
  iVar26 = 1;
  uVar18 = uVar15;
  if ((int)uVar15 < nToken) {
    uVar18 = uVar23;
  }
  iVar25 = (int)uVar30;
  if (uVar28 == uVar23) goto LAB_001255cf;
  pjVar17 = apNode[uVar28];
  if (pjVar17 == (jx9_expr_node *)0x0) goto LAB_001251c8;
  pjVar22 = pjVar17->pOp;
  uVar11 = (uint)uVar28;
  if (((pjVar22 != (jx9_expr_op *)0x0) && (pjVar22->iPrec == 2)) &&
     (pjVar17->pLeft == (jx9_expr_node *)0x0)) {
    uVar30 = uVar30 & 0xffffffff;
    if (pjVar22->iOp == 2) {
      if (-1 < iVar25) {
        pjVar8 = apNode[uVar30];
        if ((pjVar8->xCode != jx9CompileVariable) &&
           ((pjVar8->pOp == (jx9_expr_op *)0x0 || (pjVar8->pOp->iPrec != 2)))) {
LAB_00125384:
          uVar30 = uVar28 & 0xffffffff;
          goto LAB_001251c8;
        }
        for (uVar14 = uVar15; uVar7 = uVar18, (int)uVar14 < nToken; uVar14 = uVar14 + 1) {
          if (apNode[uVar14] != (jx9_expr_node *)0x0) {
            uVar5 = apNode[uVar14]->pStart->nType;
            if ((uVar5 >> 0xb & 1) == 0) {
              if ((uVar5 >> 0xc & 1) != 0) {
                uVar7 = uVar14;
                if (iVar26 < 2) break;
                iVar26 = iVar26 + -1;
              }
            }
            else {
              iVar26 = iVar26 + 1;
            }
          }
        }
        uVar5 = (uint)uVar7;
        if (uVar28 + 1 < (uVar7 & 0xffffffff)) {
          sVar4 = ExprMakeTree(pGen,apNode + uVar28 + 1,~uVar11 + uVar5);
          if (sVar4 != 0) {
            return sVar4;
          }
          SySetPut(&pjVar17->aNodeArgs,apNode + uVar28 + 1);
          pjVar8 = apNode[uVar30];
        }
        pjVar17->pLeft = pjVar8;
        pjVar17->pRight = (jx9_expr_node *)0x0;
        apNode[uVar30] = (jx9_expr_node *)0x0;
        if (uVar5 <= uVar11) {
          uVar5 = uVar11;
        }
        for (uVar30 = uVar15; uVar5 + 1 != uVar30; uVar30 = uVar30 + 1) {
          apNode[uVar30] = (jx9_expr_node *)0x0;
        }
      }
      goto LAB_001251c5;
    }
    uVar14 = uVar28 & 0xffffffff;
    uVar18 = uVar15;
    if (pjVar22->iOp == 3) {
      lVar21 = 0;
      lVar31 = -1;
      iVar26 = 0;
      do {
        if (lVar31 - uVar16 == -1) {
          sVar6 = pjVar17->pStart->nLine;
          pcVar12 = "Missing right parenthesis \')\'";
          goto LAB_00125806;
        }
        if (ppjVar19[lVar31 + 1] != (jx9_expr_node *)0x0) {
          uVar11 = ppjVar19[lVar31 + 1]->pStart->nType;
          if ((uVar11 >> 9 & 1) == 0) {
            if ((uVar11 >> 10 & 1) != 0) {
              if (iVar26 < 2) goto LAB_00125390;
              iVar26 = iVar26 + -1;
            }
          }
          else {
            iVar26 = iVar26 + 1;
          }
        }
        lVar31 = lVar31 + 1;
        lVar21 = lVar21 + 1;
      } while( true );
    }
    do {
      uVar7 = uVar18;
      if (nToken <= (int)uVar7) goto LAB_0012581a;
      uVar11 = (int)uVar14 + 1;
      uVar14 = (ulong)uVar11;
      uVar18 = uVar7 + 1;
    } while (apNode[uVar7] == (jx9_expr_node *)0x0);
    if (((int)uVar11 < nToken) && (-1 < iVar25)) {
      uVar7 = uVar7 & 0xffffffff;
      pjVar8 = apNode[uVar7];
      if ((pjVar8 != (jx9_expr_node *)0x0) &&
         (((pjVar8->pOp == (jx9_expr_op *)0x0 || (pjVar8->pLeft != (jx9_expr_node *)0x0)) &&
          (pjVar8 = apNode[uVar30], pjVar8 != (jx9_expr_node *)0x0)))) {
        if (pjVar8->pOp == (jx9_expr_op *)0x0) {
          pjVar17->pLeft = pjVar8;
          if (pjVar8->xCode != jx9CompileVariable) {
            sVar6 = pjVar17->pStart->nLine;
            pcVar12 = "\'%z\': Expecting a variable as left operand";
            goto LAB_00125891;
          }
        }
        else {
          if (pjVar8->pLeft == (jx9_expr_node *)0x0) goto LAB_0012581a;
          pjVar17->pLeft = pjVar8;
        }
        pjVar17->pRight = apNode[uVar7];
        apNode[uVar7] = (jx9_expr_node *)0x0;
        apNode[uVar30] = (jx9_expr_node *)0x0;
        goto LAB_00125384;
      }
    }
LAB_0012581a:
    sVar6 = pjVar17->pStart->nLine;
    pcVar12 = "\'%z\': Missing/Invalid member name";
    goto LAB_00125891;
  }
LAB_001251c5:
  uVar30 = uVar28 & 0xffffffff;
LAB_001251c8:
  uVar28 = uVar28 + 1;
  uVar15 = uVar15 + 1;
  uVar16 = (ulong)((int)uVar16 - 1);
  ppjVar19 = ppjVar19 + 1;
  ppjVar24 = ppjVar24 + 1;
  goto LAB_00125193;
LAB_001255cf:
  uVar30 = 0xffffffffffffffff;
  for (uVar15 = 0; uVar23 != uVar15; uVar15 = uVar15 + 1) {
    pjVar17 = apNode[uVar15];
    if (pjVar17 != (jx9_expr_node *)0x0) {
      if ((((pjVar17->pOp != (jx9_expr_op *)0x0) && (pjVar17->pOp->iPrec == 3)) &&
          (pjVar17->pLeft == (jx9_expr_node *)0x0)) && (-1 < (int)uVar30)) {
        pjVar8 = apNode[uVar30 & 0xffffffff];
        if (((pjVar8->pOp != (jx9_expr_op *)0x0) && (pjVar8->pOp->iPrec == 2)) ||
           (pjVar8->xCode == jx9CompileVariable)) {
          pjVar17->pLeft = pjVar8;
          apNode[uVar30 & 0xffffffff] = (jx9_expr_node *)0x0;
        }
      }
      uVar30 = uVar15 & 0xffffffff;
    }
  }
  uVar11 = 0xffffffff;
  uVar27 = nToken - 1;
  for (uVar5 = uVar27; -1 < (int)uVar5; uVar5 = uVar5 - 1) {
    pjVar17 = apNode[uVar5];
    uVar3 = uVar11;
    if (((pjVar17 != (jx9_expr_node *)0x0) &&
        (pjVar22 = pjVar17->pOp, uVar3 = uVar5, pjVar22 != (jx9_expr_op *)0x0)) &&
       ((pjVar22->iPrec == 3 && (pjVar17->pLeft == (jx9_expr_node *)0x0)))) {
      if (-1 < (int)uVar11) {
        pjVar8 = apNode[uVar11];
        if (pjVar8->pOp == (jx9_expr_op *)0x0) {
          if (pjVar8->xCode == jx9CompileVariable) goto LAB_0012568d;
        }
        else if (pjVar8->pOp->iPrec == 2) {
LAB_0012568d:
          pjVar17->pLeft = pjVar8;
          apNode[uVar11] = (jx9_expr_node *)0x0;
          *(byte *)&pjVar17->iFlags = (byte)pjVar17->iFlags | 1;
          goto LAB_0012567d;
        }
      }
      sVar6 = pjVar17->pStart->nLine;
      pcVar12 = "\'%z\' operator needs l-value";
      goto LAB_00125891;
    }
LAB_0012567d:
    uVar11 = uVar3;
  }
  uVar30 = 0;
  for (uVar11 = uVar27; -1 < (int)uVar11; uVar11 = uVar11 - 1) {
    pjVar17 = apNode[uVar11];
    uVar15 = uVar30;
    if (pjVar17 != (jx9_expr_node *)0x0) {
      pjVar22 = pjVar17->pOp;
      uVar15 = (ulong)uVar11;
      if (((pjVar22 != (jx9_expr_op *)0x0) && (uVar15 = (ulong)uVar11, pjVar22->iPrec == 4)) &&
         (uVar15 = (ulong)uVar11, pjVar17->pLeft == (jx9_expr_node *)0x0)) {
        if ((int)uVar30 < 1) {
          pSVar10 = pjVar17->pStart;
LAB_00125887:
          sVar6 = pSVar10->nLine;
          pcVar12 = "\'%z\': Missing operand";
          goto LAB_00125891;
        }
        pjVar17->pLeft = apNode[uVar30];
        apNode[uVar30] = (jx9_expr_node *)0x0;
        pjVar17 = pjVar17->pLeft;
        uVar15 = (ulong)uVar11;
        if (pjVar17 != (jx9_expr_node *)0x0) {
          pjVar22 = pjVar17->pOp;
          uVar15 = (ulong)uVar11;
          if (((pjVar22 != (jx9_expr_op *)0x0) && (uVar15 = (ulong)uVar11, 4 < pjVar22->iPrec)) &&
             ((pjVar17->pLeft == (jx9_expr_node *)0x0 ||
              (uVar15 = (ulong)uVar11, pjVar17->pRight == (jx9_expr_node *)0x0)))) {
            pSVar10 = pjVar17->pStart;
            goto LAB_00125887;
          }
        }
      }
    }
    uVar30 = uVar15;
  }
  uVar30 = (ulong)uVar27;
  for (sVar6 = 7; sVar6 != 0x11; sVar6 = sVar6 + 1) {
    uVar16 = 0xffffffff;
    for (uVar15 = 0; uVar15 != uVar23; uVar15 = uVar15 + 1) {
      pjVar17 = apNode[uVar15];
      if (pjVar17 != (jx9_expr_node *)0x0) {
        pjVar22 = pjVar17->pOp;
        if (((pjVar22 != (jx9_expr_op *)0x0) && (pjVar22->iPrec == sVar6)) &&
           (uVar28 = uVar15, pjVar17->pLeft == (jx9_expr_node *)0x0)) {
          do {
            if (uVar30 == uVar28) goto LAB_001257e0;
            uVar18 = uVar28 + 1;
            lVar31 = uVar28 + 1;
            uVar28 = uVar18;
          } while (apNode[lVar31] == (jx9_expr_node *)0x0);
          if (((int)uVar18 < nToken) && (-1 < (int)uVar16)) {
            uVar18 = uVar18 & 0xffffffff;
            pjVar8 = apNode[uVar18];
            if ((pjVar8 != (jx9_expr_node *)0x0) &&
               ((((pjVar8->pOp == (jx9_expr_op *)0x0 || (pjVar8->pLeft != (jx9_expr_node *)0x0)) &&
                 (pjVar8 = apNode[uVar16], pjVar8 != (jx9_expr_node *)0x0)) &&
                ((pjVar8->pOp == (jx9_expr_op *)0x0 || (pjVar8->pLeft != (jx9_expr_node *)0x0))))))
            {
              pjVar17->pLeft = pjVar8;
              pjVar17->pRight = apNode[uVar18];
              apNode[uVar18] = (jx9_expr_node *)0x0;
              apNode[uVar16] = (jx9_expr_node *)0x0;
              goto LAB_001257cf;
            }
          }
LAB_001257e0:
          pSVar10 = pjVar17->pStart;
          goto LAB_001257e4;
        }
LAB_001257cf:
        uVar16 = uVar15 & 0xffffffff;
      }
    }
  }
  uVar15 = 0xffffffffffffffff;
  lVar31 = 0;
  for (uVar16 = 0; uVar23 != uVar16; uVar16 = uVar16 + 1) {
    pjVar17 = apNode[uVar16];
    if (pjVar17 != (jx9_expr_node *)0x0) {
      pjVar22 = pjVar17->pOp;
      if (((pjVar22 != (jx9_expr_op *)0x0) && (pjVar22->iOp == 0x26)) &&
         (pjVar17->pLeft == (jx9_expr_node *)0x0)) {
        if (-1 < (int)uVar15) {
          uVar15 = uVar15 & 0xffffffff;
          pjVar8 = apNode[uVar15];
          if ((pjVar8 != (jx9_expr_node *)0x0) &&
             ((pjVar8->pOp == (jx9_expr_op *)0x0 || (pjVar8->pLeft != (jx9_expr_node *)0x0)))) {
            uVar28 = uVar16 + 1;
            uVar11 = (uint)uVar28;
            uVar18 = uVar28;
            if ((int)uVar11 < nToken) {
              uVar18 = uVar23;
            }
            iVar26 = 1;
            goto LAB_0012593b;
          }
        }
        sVar6 = pjVar17->pStart->nLine;
        pcVar12 = "\'%z\': Syntax error";
        goto LAB_00125891;
      }
      uVar15 = uVar16 & 0xffffffff;
    }
    lVar31 = lVar31 + -8;
  }
LAB_00125a63:
  uVar11 = 0xffffffff;
  for (; -1 < (int)uVar27; uVar27 = uVar27 - 1) {
    uVar15 = (ulong)uVar27;
    pjVar17 = apNode[uVar15];
    uVar5 = uVar11;
    if (((pjVar17 != (jx9_expr_node *)0x0) &&
        (pjVar22 = pjVar17->pOp, uVar5 = uVar27, pjVar22 != (jx9_expr_op *)0x0)) &&
       ((pjVar22->iPrec == 0x12 && (pjVar17->pLeft == (jx9_expr_node *)0x0)))) {
      do {
        bVar32 = uVar15 == 0;
        uVar15 = uVar15 - 1;
        if (bVar32) goto LAB_00125b59;
      } while (apNode[uVar15] == (jx9_expr_node *)0x0);
      if (-1 < (int)uVar11) {
        pjVar8 = apNode[uVar11];
        if ((pjVar8 != (jx9_expr_node *)0x0) &&
           ((pjVar8->pOp == (jx9_expr_op *)0x0 || (pjVar8->pLeft != (jx9_expr_node *)0x0)))) {
          uVar15 = uVar15 & 0xffffffff;
          pjVar20 = apNode[uVar15];
          if (pjVar20 != (jx9_expr_node *)0x0) {
            ppjVar2 = &pjVar20->pOp;
            if (*ppjVar2 == (jx9_expr_op *)0x0) {
LAB_00125b26:
              if (pjVar20->xCode != jx9CompileVariable) goto LAB_00125b33;
            }
            else {
              pjVar20 = pjVar20->pLeft;
              if (pjVar20 == (jx9_expr_node *)0x0) goto LAB_00125b59;
              iVar26 = (*ppjVar2)->iOp;
              if (iVar26 != 0) {
                if (iVar26 == 2) {
                  if (pjVar20->pOp == (jx9_expr_op *)0x0) goto LAB_00125b26;
                  if ((pjVar20->pOp->iOp & 0xfffffffdU) == 0) goto LAB_00125b3e;
                }
LAB_00125b33:
                if (pjVar22->iVmOp != 0x2a) {
                  sVar6 = pjVar17->pStart->nLine;
                  pcVar12 = "\'%z\': Left operand must be a modifiable l-value";
                  goto LAB_00125891;
                }
              }
            }
LAB_00125b3e:
            pjVar17->pLeft = pjVar8;
            pjVar17->pRight = apNode[uVar15];
            apNode[uVar11] = (jx9_expr_node *)0x0;
            apNode[uVar15] = (jx9_expr_node *)0x0;
            goto LAB_00125b1c;
          }
        }
      }
LAB_00125b59:
      pSVar10 = pjVar17->pStart;
      goto LAB_001257e4;
    }
LAB_00125b1c:
    uVar11 = uVar5;
  }
  uVar15 = 0xffffffffffffffff;
  for (uVar16 = 0; uVar16 != uVar23; uVar16 = uVar16 + 1) {
    pjVar17 = apNode[uVar16];
    if (pjVar17 != (jx9_expr_node *)0x0) {
      pjVar22 = pjVar17->pOp;
      if (((pjVar22 != (jx9_expr_op *)0x0) && (pjVar22->iPrec == 0x16)) &&
         (uVar28 = uVar16, pjVar17->pLeft == (jx9_expr_node *)0x0)) {
        do {
          if (uVar30 == uVar28) goto LAB_00125bfe;
          uVar18 = uVar28 + 1;
          lVar31 = uVar28 + 1;
          uVar28 = uVar18;
        } while (apNode[lVar31] == (jx9_expr_node *)0x0);
        if (((int)uVar18 < nToken) && (-1 < (int)uVar15)) {
          uVar18 = uVar18 & 0xffffffff;
          pjVar8 = apNode[uVar18];
          if ((pjVar8 != (jx9_expr_node *)0x0) &&
             ((pjVar8->pOp == (jx9_expr_op *)0x0 || (pjVar8->pLeft != (jx9_expr_node *)0x0)))) {
            pjVar8 = apNode[uVar15 & 0xffffffff];
            if ((pjVar8 != (jx9_expr_node *)0x0) &&
               ((pjVar8->pOp == (jx9_expr_op *)0x0 || (pjVar8->pLeft != (jx9_expr_node *)0x0)))) {
              pjVar17->pLeft = pjVar8;
              pjVar17->pRight = apNode[uVar18];
              apNode[uVar18] = (jx9_expr_node *)0x0;
              apNode[uVar15 & 0xffffffff] = (jx9_expr_node *)0x0;
              goto LAB_00125bf4;
            }
          }
        }
LAB_00125bfe:
        pSVar10 = pjVar17->pStart;
LAB_001257e4:
        sVar6 = pSVar10->nLine;
        pcVar12 = "\'%z\': Missing/Invalid operand";
        goto LAB_00125891;
      }
LAB_00125bf4:
      uVar15 = uVar16 & 0xffffffff;
    }
  }
  uVar30 = 1;
  do {
    if (uVar23 <= uVar30) {
      return 0;
    }
    pjVar17 = apNode[uVar30];
    if (pjVar17 != (jx9_expr_node *)0x0) {
      if (((pjVar17->pOp != (jx9_expr_op *)0x0) || (pjVar17->xCode != (ProcNodeConstruct)0x0)) &&
         (*apNode != (jx9_expr_node *)0x0)) {
        pjVar22 = (jx9_expr_op *)pjVar17->pStart;
        sVar6 = pjVar22->iPrec;
        pcVar12 = "Unexpected token \'%z\'";
        goto LAB_00125891;
      }
      *apNode = pjVar17;
      apNode[uVar30] = (jx9_expr_node *)0x0;
    }
    uVar30 = uVar30 + 1;
  } while( true );
LAB_0012593b:
  local_80 = uVar18 & 0xffffffff;
  if (nToken <= (int)uVar28) goto LAB_001259ac;
  pjVar8 = apNode[uVar28];
  if (pjVar8 != (jx9_expr_node *)0x0) {
    if (((pjVar8->pOp == (jx9_expr_op *)0x0) || (pjVar8->pOp->iOp != 0x26)) ||
       (pjVar8->pCond != (jx9_expr_node *)0x0)) {
      if ((pjVar8->pStart->nType & 0x100000) != 0) {
        local_80 = uVar28;
        if (iVar26 < 2) goto LAB_001259ac;
        iVar26 = iVar26 + -1;
      }
    }
    else {
      iVar26 = iVar26 + 1;
    }
  }
  uVar28 = uVar28 + 1;
  goto LAB_0012593b;
LAB_00125390:
  if (((iVar25 < 0) || (pjVar8 = apNode[uVar30], pjVar8 == (jx9_expr_node *)0x0)) ||
     ((pjVar8->pOp != (jx9_expr_op *)0x0 && (pjVar8->pLeft == (jx9_expr_node *)0x0)))) {
    sVar6 = pjVar17->pStart->nLine;
    pcVar12 = "Invalid function name";
LAB_00125806:
    iVar26 = jx9GenCompileError(pGen,1,sVar6,pcVar12);
    goto LAB_001258a0;
  }
  if (1 < lVar31 + 1U) {
    iVar26 = 0;
LAB_001253ee:
    iVar25 = (int)lVar31;
    if (iVar26 < iVar25) {
      iVar13 = 0;
      for (lVar29 = (long)iVar26; iVar1 = iVar25, lVar31 != lVar29; lVar29 = lVar29 + 1) {
        pjVar8 = ppjVar19[lVar29 + 1];
        if (pjVar8 != (jx9_expr_node *)0x0) {
          uVar11 = pjVar8->pStart->nType;
          if ((((uVar11 >> 0x11 & 1) != 0) && (pjVar8->pLeft == (jx9_expr_node *)0x0)) &&
             (iVar13 < 1)) {
            iVar1 = (int)lVar29;
            break;
          }
          if ((uVar11 & 0xa40) == 0) {
            iVar13 = iVar13 + -1 + (uint)((uVar11 & 0x1480) == 0);
          }
          else {
            iVar13 = iVar13 + 1;
          }
        }
      }
      if (iVar1 - iVar26 == 0 || iVar1 < iVar26) {
        pSVar10 = pjVar17->pStart;
        goto LAB_001258c7;
      }
      ppjVar9 = apNode + uVar28 + (long)iVar26 + 1;
      ExprMakeTree(pGen,ppjVar9,iVar1 - iVar26);
      if (*ppjVar9 != (jx9_expr_node *)0x0) goto code_r0x0012547e;
      sVar6 = pjVar17->pStart->nLine;
      pcVar12 = "Empty function argument";
      goto LAB_00125806;
    }
    pjVar8 = apNode[uVar30];
  }
  pjVar17->pLeft = pjVar8;
  apNode[uVar30] = (jx9_expr_node *)0x0;
  ppjVar9 = ppjVar24;
  while (bVar32 = lVar21 != 0, lVar21 = lVar21 + -1, bVar32) {
    *ppjVar9 = (jx9_expr_node *)0x0;
    ppjVar9 = ppjVar9 + 1;
  }
  goto LAB_001251c5;
code_r0x0012547e:
  SySetPut(&pjVar17->aNodeArgs,ppjVar9);
  iVar26 = iVar1;
  if (((lVar29 < lVar31) && (apNode[uVar28 + (long)iVar1 + 1] != (jx9_expr_node *)0x0)) &&
     (((apNode[uVar28 + (long)iVar1 + 1]->pStart->nType & 0x20000) != 0 &&
      (iVar26 = iVar1 + 1, iVar25 <= iVar26)))) {
    pSVar10 = pjVar17->pStart;
LAB_001258c7:
    sVar6 = pSVar10->nLine;
    pcVar12 = "Missing function argument";
    goto LAB_00125806;
  }
  goto LAB_001253ee;
LAB_001259ac:
  uVar5 = (uint)local_80;
  if (uVar11 < uVar5) {
    sVar4 = ExprMakeTree(pGen,(jx9_expr_node **)((long)apNode + (8 - lVar31)),~(uint)uVar16 + uVar5)
    ;
    if (sVar4 != 0) {
      return sVar4;
    }
    pjVar17->pLeft = apNode[uVar16 + 1];
    apNode[uVar16 + 1] = (jx9_expr_node *)0x0;
    if ((int)(uVar5 + 1) < nToken) {
      ppjVar24 = apNode + (uVar5 + 1);
      sVar4 = ExprMakeTree(pGen,ppjVar24,~uVar5 + nToken);
      if (sVar4 != 0) {
        return sVar4;
      }
      pjVar17->pRight = *ppjVar24;
      apNode[local_80 & 0xffffffff] = (jx9_expr_node *)0x0;
      *ppjVar24 = (jx9_expr_node *)0x0;
      pjVar17->pCond = apNode[uVar15];
      apNode[uVar15] = (jx9_expr_node *)0x0;
      goto LAB_00125a63;
    }
    pjVar22 = pjVar17->pOp;
    sVar6 = pjVar17->pStart->nLine;
    pcVar12 = "\'%z\': Missing \'else\' expression";
  }
  else {
    sVar6 = pjVar17->pStart->nLine;
    pcVar12 = "\'%z\': Missing \'then\' expression";
  }
LAB_00125891:
  iVar26 = jx9GenCompileError(pGen,1,sVar6,pcVar12,pjVar22);
LAB_001258a0:
  return (uint)(iVar26 == -10) * 2 | 0xfffffff4;
}

Assistant:

static sxi32 ExprMakeTree(jx9_gen_state *pGen, jx9_expr_node **apNode, sxi32 nToken)
 {
	 sxi32 i, iLeft, iRight;
	 jx9_expr_node *pNode;
	 sxi32 iCur;
	 sxi32 rc;
	 if( nToken <= 0 || (nToken == 1 && apNode[0]->xCode) ){
		 /* TICKET 1433-17: self evaluating node */
		 return SXRET_OK;
	 }
	 /* Process expressions enclosed in parenthesis first */
	 for( iCur =  0 ; iCur < nToken ; ++iCur ){
		 sxi32 iNest;
		 /* Note that, we use strict comparison here '!=' instead of the bitwise and '&' operator
		  * since the LPAREN token can also be an operator [i.e: Function call].
		  */
		 if( apNode[iCur] == 0 || apNode[iCur]->pStart->nType != JX9_TK_LPAREN ){
			 continue;
		 }
		 iNest = 1;
		 iLeft = iCur;
		 /* Find the closing parenthesis */
		 iCur++;
		 while( iCur < nToken ){
			 if( apNode[iCur] ){
				 if( apNode[iCur]->pStart->nType & JX9_TK_RPAREN /* ')' */){
					 /* Decrement nesting level */
					 iNest--;
					 if( iNest <= 0 ){
						 break;
					 }
				 }else if( apNode[iCur]->pStart->nType & JX9_TK_LPAREN /* '(' */ ){
					 /* Increment nesting level */
					 iNest++;
				 }
			 }
			 iCur++;
		 }
		 if( iCur - iLeft > 1 ){
			 /* Recurse and process this expression */
			 rc = ExprMakeTree(&(*pGen), &apNode[iLeft + 1], iCur - iLeft - 1);
			 if( rc != SXRET_OK ){
				 return rc;
			 }
		 }
		 /* Free the left and right nodes */
		 ExprFreeTree(&(*pGen), apNode[iLeft]);
		 ExprFreeTree(&(*pGen), apNode[iCur]);
		 apNode[iLeft] = 0;
		 apNode[iCur] = 0;
	 }
	 /* Handle postfix [i.e: function call, member access] operators with precedence 2 */
	 iLeft = -1;
	 for( iCur = 0 ; iCur < nToken ; ++iCur ){
		 if( apNode[iCur] == 0 ){
			 continue;
		 }
		 pNode = apNode[iCur];
		 if( pNode->pOp && pNode->pOp->iPrec == 2 && pNode->pLeft == 0  ){
			 if( pNode->pOp->iOp == EXPR_OP_FUNC_CALL ){
				 /* Collect function arguments */
				 sxi32 iPtr = 0;
				 sxi32 nFuncTok = 0;
				 while( nFuncTok + iCur < nToken ){
					 if( apNode[nFuncTok+iCur] ){
						 if( apNode[nFuncTok+iCur]->pStart->nType & JX9_TK_LPAREN /*'('*/ ){
							 iPtr++;
						 }else if ( apNode[nFuncTok+iCur]->pStart->nType & JX9_TK_RPAREN /*')'*/){
							 iPtr--;
							 if( iPtr <= 0 ){
								 break;
							 }
						 }
					 }
					 nFuncTok++;
				 }
				 if( nFuncTok + iCur >= nToken ){
					 /* Syntax error */
					 rc = jx9GenCompileError(pGen, E_ERROR, pNode->pStart->nLine, "Missing right parenthesis ')'");
					 if( rc != SXERR_ABORT ){
						 rc = SXERR_SYNTAX;
					 }
					 return rc; 
				 }
				 if(  iLeft < 0 || !NODE_ISTERM(iLeft) /*|| ( apNode[iLeft]->pOp && apNode[iLeft]->pOp->iPrec != 2)*/ ){
					 /* Syntax error */
					 rc = jx9GenCompileError(pGen, E_ERROR, pNode->pStart->nLine, "Invalid function name");
					 if( rc != SXERR_ABORT ){
						 rc = SXERR_SYNTAX;
					 }
					 return rc;
				 }
				 if( nFuncTok > 1 ){
					 /* Process function arguments */
					 rc = ExprProcessFuncArguments(&(*pGen), pNode, &apNode[iCur+1], nFuncTok-1);
					 if( rc != SXRET_OK ){
						 return rc;
					 }
				 }
				 /* Link the node to the tree */
				 pNode->pLeft = apNode[iLeft];
				 apNode[iLeft] = 0;
				 for( iPtr = 1; iPtr <= nFuncTok ; iPtr++ ){
					 apNode[iCur+iPtr] = 0;
				 }
			 }else if (pNode->pOp->iOp == EXPR_OP_SUBSCRIPT ){
				 /* Subscripting */
				 sxi32 iArrTok = iCur + 1;
				 sxi32 iNest = 1;
				 if(  iLeft >= 0 && (apNode[iLeft]->xCode == jx9CompileVariable || (apNode[iLeft]->pOp && apNode[iLeft]->pOp->iPrec == 2 /* postfix */) ) ){
					 /* Collect index tokens */
				    while( iArrTok < nToken ){
					 if( apNode[iArrTok] ){
						 if( apNode[iArrTok]->pStart->nType & JX9_TK_OSB /*'['*/){
							 /* Increment nesting level */
							 iNest++;
						 }else if( apNode[iArrTok]->pStart->nType & JX9_TK_CSB /*']'*/){
							 /* Decrement nesting level */
							 iNest--;
							 if( iNest <= 0 ){
								 break;
							 }
						 }
					 }
					 ++iArrTok;
				   }
				   if( iArrTok > iCur + 1 ){
					 /* Recurse and process this expression */
					 rc = ExprMakeTree(&(*pGen), &apNode[iCur+1], iArrTok - iCur - 1);
					 if( rc != SXRET_OK ){
						 return rc;
					 }
					 /* Link the node to it's index */
					 SySetPut(&pNode->aNodeArgs, (const void *)&apNode[iCur+1]);
				   }
				   /* Link the node to the tree */
				   pNode->pLeft = apNode[iLeft];
				   pNode->pRight = 0;
				   apNode[iLeft] = 0;
				   for( iNest = iCur + 1 ; iNest <= iArrTok ; ++iNest ){
					 apNode[iNest] = 0;
				  }
				 }
			 }else{
				 /* Member access operators [i.e: '.' ] */
				 iRight = iCur + 1;
				 while( iRight < nToken && apNode[iRight] == 0 ){
					 iRight++;
				 }
				 if( iRight >= nToken || iLeft < 0 || !NODE_ISTERM(iRight) || !NODE_ISTERM(iLeft) ){
					 /* Syntax error */
					 rc = jx9GenCompileError(pGen, E_ERROR, pNode->pStart->nLine, "'%z': Missing/Invalid member name", &pNode->pOp->sOp);
					 if( rc != SXERR_ABORT ){
						 rc = SXERR_SYNTAX;
					 }
					 return rc;
				 }
				 /* Link the node to the tree */
				 pNode->pLeft = apNode[iLeft];
				 if( pNode->pLeft->pOp == 0 && pNode->pLeft->xCode != jx9CompileVariable ){
					 /* Syntax error */
					 rc = jx9GenCompileError(pGen, E_ERROR, pNode->pStart->nLine, 
						 "'%z': Expecting a variable as left operand", &pNode->pOp->sOp);
					 if( rc != SXERR_ABORT ){
						 rc = SXERR_SYNTAX;
					 }
					 return rc;
				 }
				 pNode->pRight = apNode[iRight];
				 apNode[iLeft] = apNode[iRight] = 0;
			 }
		 }
		 iLeft = iCur;
	 }
	  /* Handle post/pre icrement/decrement [i.e: ++/--] operators with precedence 3 */
	 iLeft = -1;
	 for( iCur = 0 ; iCur < nToken ; ++iCur ){
		 if( apNode[iCur] == 0 ){
			 continue;
		 }
		 pNode = apNode[iCur];
		 if( pNode->pOp && pNode->pOp->iPrec == 3 && pNode->pLeft == 0){
			 if( iLeft >= 0 && ((apNode[iLeft]->pOp && apNode[iLeft]->pOp->iPrec == 2 /* Postfix */)
				 || apNode[iLeft]->xCode == jx9CompileVariable) ){
					 /* Link the node to the tree */
					 pNode->pLeft = apNode[iLeft];
					 apNode[iLeft] = 0; 
			 }
		  }
		 iLeft = iCur;
	  }
	 iLeft = -1;
	 for( iCur = nToken -  1 ; iCur >= 0 ; iCur-- ){
		 if( apNode[iCur] == 0 ){
			 continue;
		 }
		 pNode = apNode[iCur];
		 if( pNode->pOp && pNode->pOp->iPrec == 3 && pNode->pLeft == 0){
			 if( iLeft < 0 || (apNode[iLeft]->pOp == 0 && apNode[iLeft]->xCode != jx9CompileVariable)
				 || ( apNode[iLeft]->pOp && apNode[iLeft]->pOp->iPrec != 2 /* Postfix */) ){
					 /* Syntax error */
					 rc = jx9GenCompileError(pGen, E_ERROR, pNode->pStart->nLine, "'%z' operator needs l-value", &pNode->pOp->sOp);
					 if( rc != SXERR_ABORT ){
						 rc = SXERR_SYNTAX;
					 }
					 return rc;
			 }
			 /* Link the node to the tree */
			 pNode->pLeft = apNode[iLeft];
			 apNode[iLeft] = 0;
			 /* Mark as pre-increment/decrement node */
			 pNode->iFlags |= EXPR_NODE_PRE_INCR;
		  }
		 iLeft = iCur;
	 }
	 /* Handle right associative unary and cast operators [i.e: !, (string), ~...]  with precedence 4 */
	  iLeft = 0;
	  for( iCur = nToken -  1 ; iCur >= 0 ; iCur-- ){
		  if( apNode[iCur] ){
			  pNode = apNode[iCur];
			  if( pNode->pOp && pNode->pOp->iPrec == 4 && pNode->pLeft == 0){
				  if( iLeft > 0 ){
					  /* Link the node to the tree */
					  pNode->pLeft = apNode[iLeft];
					  apNode[iLeft] = 0;
					  if( pNode->pLeft && pNode->pLeft->pOp && pNode->pLeft->pOp->iPrec > 4 ){
						  if( pNode->pLeft->pLeft == 0 || pNode->pLeft->pRight == 0 ){
							   /* Syntax error */
							  rc = jx9GenCompileError(pGen, E_ERROR, pNode->pLeft->pStart->nLine, "'%z': Missing operand", &pNode->pLeft->pOp->sOp);
							  if( rc != SXERR_ABORT ){
								  rc = SXERR_SYNTAX;
							  }
							  return rc;
						  }
					  }
				  }else{
					  /* Syntax error */
					  rc = jx9GenCompileError(pGen, E_ERROR, pNode->pStart->nLine, "'%z': Missing operand", &pNode->pOp->sOp);
					  if( rc != SXERR_ABORT ){
						  rc = SXERR_SYNTAX;
					  }
					  return rc;
				  }
			  }
			  /* Save terminal position */
			  iLeft = iCur;
		  }
	  }	 
	 /* Process left and non-associative binary operators [i.e: *, /, &&, ||...]*/
	 for( i = 7 ; i < 17 ; i++ ){
		 iLeft = -1;
		 for( iCur = 0 ; iCur < nToken ; ++iCur ){
			 if( apNode[iCur] == 0 ){
				 continue;
			 }
			 pNode = apNode[iCur];
			 if( pNode->pOp && pNode->pOp->iPrec == i && pNode->pLeft == 0 ){
				 /* Get the right node */
				 iRight = iCur + 1;
				 while( iRight < nToken && apNode[iRight] == 0 ){
					 iRight++;
				 }
				 if( iRight >= nToken || iLeft < 0 || !NODE_ISTERM(iRight) || !NODE_ISTERM(iLeft) ){
					 /* Syntax error */
					 rc = jx9GenCompileError(pGen, E_ERROR, pNode->pStart->nLine, "'%z': Missing/Invalid operand", &pNode->pOp->sOp);
					 if( rc != SXERR_ABORT ){
						 rc = SXERR_SYNTAX;
					 }
					 return rc; 
				 }
				 /* Link the node to the tree */
				 pNode->pLeft = apNode[iLeft];
				 pNode->pRight = apNode[iRight];
				 apNode[iLeft] = apNode[iRight] = 0;
			 }
			 iLeft = iCur;
		 }
	 }
	 /* Handle the ternary operator. (expr1) ? (expr2) : (expr3) 
	  * Note that we do not need a precedence loop here since
	  * we are dealing with a single operator.
	  */
	  iLeft = -1;
	  for( iCur = 0 ; iCur < nToken ; ++iCur ){
		  if( apNode[iCur] == 0 ){
			  continue;
		  }
		  pNode = apNode[iCur];
		  if( pNode->pOp && pNode->pOp->iOp == EXPR_OP_QUESTY && pNode->pLeft == 0 ){
			  sxi32 iNest = 1;
			  if( iLeft < 0 || !NODE_ISTERM(iLeft) ){
				  /* Missing condition */
				  rc = jx9GenCompileError(pGen, E_ERROR, pNode->pStart->nLine, "'%z': Syntax error", &pNode->pOp->sOp);
				  if( rc != SXERR_ABORT ){
					  rc = SXERR_SYNTAX;
				  }
				  return rc;
			  }
			  /* Get the right node */
			  iRight = iCur + 1;
			  while( iRight < nToken  ){
				  if( apNode[iRight] ){
					  if( apNode[iRight]->pOp && apNode[iRight]->pOp->iOp == EXPR_OP_QUESTY && apNode[iRight]->pCond == 0){
						  /* Increment nesting level */
						  ++iNest;
					  }else if( apNode[iRight]->pStart->nType & JX9_TK_COLON /*:*/ ){
						  /* Decrement nesting level */
						  --iNest;
						  if( iNest <= 0 ){
							  break;
						  }
					  }
				  }
				  iRight++;
			  }
			  if( iRight > iCur + 1 ){
				  /* Recurse and process the then expression */
				  rc = ExprMakeTree(&(*pGen), &apNode[iCur + 1], iRight - iCur - 1);
				  if( rc != SXRET_OK ){
					  return rc;
				  }
				  /* Link the node to the tree */
				  pNode->pLeft = apNode[iCur + 1];
			  }else{
				  rc = jx9GenCompileError(pGen, E_ERROR, pNode->pStart->nLine, "'%z': Missing 'then' expression", &pNode->pOp->sOp);
				  if( rc != SXERR_ABORT ){
					 rc = SXERR_SYNTAX;
				 }
				 return rc;
			  }
			  apNode[iCur + 1] = 0;
			  if( iRight + 1 < nToken ){
				  /* Recurse and process the else expression */
				  rc = ExprMakeTree(&(*pGen), &apNode[iRight + 1], nToken - iRight - 1);
				  if( rc != SXRET_OK ){
					  return rc;
				  }
				  /* Link the node to the tree */
				  pNode->pRight = apNode[iRight + 1];
				  apNode[iRight + 1] =  apNode[iRight] = 0;
			  }else{
				  rc = jx9GenCompileError(pGen, E_ERROR, pNode->pStart->nLine, "'%z': Missing 'else' expression", &pNode->pOp->sOp);
				  if( rc != SXERR_ABORT ){
					 rc = SXERR_SYNTAX;
				 }
				 return rc;
			  }
			  /* Point to the condition */
			  pNode->pCond  = apNode[iLeft];
			  apNode[iLeft] = 0;
			  break;
		  }
		  iLeft = iCur;
	  }
	 /* Process right associative binary operators [i.e: '=', '+=', '/='] 
	  * Note: All right associative binary operators have precedence 18
	  * so there is no need for a precedence loop here.
	  */
	 iRight = -1;
	 for( iCur = nToken -  1 ; iCur >= 0 ; iCur--){
		 if( apNode[iCur] == 0 ){
			 continue;
		 }
		 pNode = apNode[iCur];
		 if( pNode->pOp && pNode->pOp->iPrec == 18 && pNode->pLeft == 0 ){
			 /* Get the left node */
			 iLeft = iCur - 1;
			 while( iLeft >= 0 && apNode[iLeft] == 0 ){
				 iLeft--;
			 }
			 if( iLeft < 0 || iRight < 0 || !NODE_ISTERM(iRight) || !NODE_ISTERM(iLeft) ){
				 /* Syntax error */
				 rc = jx9GenCompileError(pGen, E_ERROR, pNode->pStart->nLine, "'%z': Missing/Invalid operand", &pNode->pOp->sOp);
				 if( rc != SXERR_ABORT ){
					 rc = SXERR_SYNTAX;
				 }
				 return rc;
			 }
			 if( ExprIsModifiableValue(apNode[iLeft]) == FALSE ){
				 if( pNode->pOp->iVmOp != JX9_OP_STORE  ){
					 /* Left operand must be a modifiable l-value */
					 rc = jx9GenCompileError(pGen, E_ERROR, pNode->pStart->nLine, 
						 "'%z': Left operand must be a modifiable l-value", &pNode->pOp->sOp);
					 if( rc != SXERR_ABORT ){
						 rc = SXERR_SYNTAX;
					 }
					 return rc; 
				 }
			 }
			 /* Link the node to the tree (Reverse) */
			 pNode->pLeft = apNode[iRight];
			 pNode->pRight = apNode[iLeft];
			 apNode[iLeft] = apNode[iRight] = 0;
		 }
		 iRight = iCur;
	 }
	 /* Process the lowest precedence operator (22, comma) */
	 iLeft = -1;
	 for( iCur = 0 ; iCur < nToken ; ++iCur ){
		 if( apNode[iCur] == 0 ){
			 continue;
		 }
		 pNode = apNode[iCur];
		 if( pNode->pOp && pNode->pOp->iPrec == 22 /* ',' */ && pNode->pLeft == 0 ){
			 /* Get the right node */
			 iRight = iCur + 1;
			 while( iRight < nToken && apNode[iRight] == 0 ){
				 iRight++;
			 }
			 if( iRight >= nToken || iLeft < 0 || !NODE_ISTERM(iRight) || !NODE_ISTERM(iLeft) ){
				 /* Syntax error */
				 rc = jx9GenCompileError(pGen, E_ERROR, pNode->pStart->nLine, "'%z': Missing/Invalid operand", &pNode->pOp->sOp);
				 if( rc != SXERR_ABORT ){
					 rc = SXERR_SYNTAX;
				 }
				 return rc;
			 }
			 /* Link the node to the tree */
			 pNode->pLeft = apNode[iLeft];
			 pNode->pRight = apNode[iRight];
			 apNode[iLeft] = apNode[iRight] = 0;
		 }
		 iLeft = iCur;
	 }
	 /* Point to the root of the expression tree */
	 for( iCur = 1 ; iCur < nToken ; ++iCur ){
		 if( apNode[iCur] ){
			 if( (apNode[iCur]->pOp || apNode[iCur]->xCode ) && apNode[0] != 0){
				 rc = jx9GenCompileError(pGen, E_ERROR, apNode[iCur]->pStart->nLine, "Unexpected token '%z'", &apNode[iCur]->pStart->sData);
				  if( rc != SXERR_ABORT ){
					  rc = SXERR_SYNTAX;
				  }
				  return rc;  
			 }
			 apNode[0] = apNode[iCur];
			 apNode[iCur] = 0;
		 }
	 }
	 return SXRET_OK;
 }